

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O1

_Bool run_bitset_container_andnot
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint64_t *puVar5;
  int iVar6;
  array_container_t *paVar7;
  bitset_container_t *bitset;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int run_value;
  int iVar12;
  uint uVar13;
  uint uVar14;
  
  iVar6 = run_container_cardinality(src_1);
  if (iVar6 < 0x1001) {
    paVar7 = array_container_create_given_capacity(iVar6);
    paVar7->cardinality = 0;
    iVar6 = src_1->n_runs;
    if (0 < (long)iVar6) {
      prVar4 = src_1->runs;
      puVar5 = src_2->words;
      lVar11 = 0;
      do {
        uVar10 = (ulong)prVar4[lVar11].value;
        iVar12 = prVar4[lVar11].length + 1;
        do {
          if ((*(ulong *)((long)puVar5 + (ulong)((uint)(uVar10 >> 3) & 0x1ff8)) >> (uVar10 & 0x3f) &
              1) == 0) {
            iVar3 = paVar7->cardinality;
            paVar7->cardinality = iVar3 + 1;
            paVar7->array[iVar3] = (uint16_t)uVar10;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    *dst = paVar7;
  }
  else {
    bitset = bitset_container_clone(src_2);
    iVar6 = src_1->n_runs;
    if ((long)iVar6 < 1) {
      uVar13 = 0;
    }
    else {
      prVar4 = src_1->runs;
      puVar5 = bitset->words;
      lVar11 = 0;
      uVar13 = 0;
      do {
        uVar1 = prVar4[lVar11].value;
        uVar2 = prVar4[lVar11].length;
        bVar8 = (byte)uVar1;
        if (uVar13 != uVar1) {
          uVar9 = uVar13 >> 6;
          uVar10 = -1L << ((byte)uVar13 & 0x3f);
          uVar13 = uVar1 - 1 >> 6;
          if (uVar13 - uVar9 == 0) {
            uVar10 = (uVar10 << (-bVar8 & 0x3f)) >> (-bVar8 & 0x3f);
            uVar13 = uVar9;
          }
          else {
            puVar5[uVar9] = puVar5[uVar9] & ~uVar10;
            if (uVar9 + 1 < uVar13) {
              memset(puVar5 + (ulong)uVar9 + 1,0,(ulong)((uVar13 - uVar9) - 2) * 8 + 8);
            }
            uVar10 = 0xffffffffffffffff >> (-bVar8 & 0x3f);
          }
          puVar5[uVar13] = puVar5[uVar13] & ~uVar10;
        }
        uVar13 = (uint)uVar2 + (uint)uVar1 + 1;
        if (uVar13 != uVar1) {
          uVar14 = (uint)uVar2 + (uint)uVar1;
          uVar10 = (ulong)(uint)(uVar1 >> 6);
          uVar9 = uVar14 >> 6;
          puVar5[uVar10] = ~(-1L << (bVar8 & 0x3f) ^ puVar5[uVar10]);
          if (uVar1 >> 6 < uVar9) {
            do {
              puVar5[uVar10] = ~puVar5[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
          }
          puVar5[uVar9] = puVar5[uVar9] ^ 0xffffffffffffffffU >> (~(byte)uVar14 & 0x3f);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    if (uVar13 != 0x10000) {
      puVar5 = bitset->words;
      uVar9 = uVar13 >> 6;
      puVar5[uVar9] = puVar5[uVar9] & ~(-1L << ((byte)uVar13 & 0x3f));
      if (uVar9 != 0x3ff) {
        if (uVar13 < 0xff80) {
          memset((void *)((long)puVar5 + (ulong)(uVar13 >> 3 & 0x1ff8) + 8),0,
                 (ulong)(0x3fd - uVar9) * 8 + 8);
        }
        puVar5[0x3ff] = 0;
      }
    }
    iVar6 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar6;
    if (0x1000 < iVar6) {
      *dst = bitset;
      return true;
    }
    paVar7 = array_container_from_bitset(bitset);
    *dst = paVar7;
    bitset_container_free(bitset);
  }
  return false;
}

Assistant:

bool run_bitset_container_andnot(const run_container_t *src_1,
                                 const bitset_container_t *src_2,
                                 container_t **dst) {
    // follows the Java implementation as of June 2016
    int card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // must be an array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            for (int run_value = rle.value; run_value <= rle.value + rle.length;
                 ++run_value) {
                if (!bitset_container_get(src_2, (uint16_t)run_value)) {
                    answer->array[answer->cardinality++] = (uint16_t)run_value;
                }
            }
        }
        *dst = answer;
        return false;
    } else {  // we guess it will be a bitset, though have to check guess when
              // done
        bitset_container_t *answer = bitset_container_clone(src_2);

        uint32_t last_pos = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];

            uint32_t start = rle.value;
            uint32_t end = start + rle.length + 1;
            bitset_reset_range(answer->words, last_pos, start);
            bitset_flip_range(answer->words, start, end);
            last_pos = end;
        }
        bitset_reset_range(answer->words, last_pos, (uint32_t)(1 << 16));

        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality <= DEFAULT_MAX_SIZE) {
            *dst = array_container_from_bitset(answer);
            bitset_container_free(answer);
            return false;  // not bitset
        }
        *dst = answer;
        return true;  // bitset
    }
}